

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  byte bVar1;
  uchar uVar2;
  uchar *puVar3;
  undefined8 *puVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                    ,0x6e1,
                    "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                   );
    }
    uVar14 = 0;
    puVar3 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar3 == (uchar *)0x0) {
      free(data);
      puVar4 = (undefined8 *)__tls_get_addr(&PTR_001f0f18);
      *puVar4 = "Out of memory";
      data = (uchar *)0x0;
    }
    else {
      uVar13 = (ulong)y;
      if ((int)y < 1) {
        uVar13 = uVar14;
      }
      iVar9 = req_comp + img_n * 8;
      iVar8 = x - 1;
      uVar11 = 0;
      for (uVar12 = 0; uVar12 != uVar13; uVar12 = uVar12 + 1) {
        if (0x19 < iVar9 - 10U) {
switchD_001beea3_caseD_d:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                        ,0x6fe,
                        "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                       );
        }
        iVar5 = (int)uVar12 * x;
        pbVar10 = data + (uint)(iVar5 * img_n);
        pbVar6 = puVar3 + (uint)(iVar5 * req_comp);
        switch(iVar9) {
        case 10:
          lVar7 = 0;
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            puVar3[lVar7 * 2 + uVar14] = data[lVar7 + uVar11];
            puVar3[lVar7 * 2 + uVar14 + 1] = 0xff;
            lVar7 = lVar7 + 1;
          }
          break;
        case 0xb:
          pbVar6 = puVar3 + uVar14 + 2;
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            bVar1 = *pbVar10;
            *pbVar6 = bVar1;
            pbVar6[-1] = bVar1;
            pbVar6[-2] = bVar1;
            pbVar10 = pbVar10 + 1;
            pbVar6 = pbVar6 + 3;
          }
          break;
        case 0xc:
          lVar7 = 0;
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            uVar2 = data[lVar7 + uVar11];
            puVar3[lVar7 * 4 + uVar14 + 2] = uVar2;
            puVar3[lVar7 * 4 + uVar14 + 1] = uVar2;
            puVar3[lVar7 * 4 + uVar14] = uVar2;
            puVar3[lVar7 * 4 + uVar14 + 3] = 0xff;
            lVar7 = lVar7 + 1;
          }
          break;
        default:
          goto switchD_001beea3_caseD_d;
        case 0x11:
          lVar7 = 0;
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            puVar3[lVar7 + uVar14] = data[lVar7 * 2 + uVar11];
            lVar7 = lVar7 + 1;
          }
          break;
        case 0x13:
          pbVar6 = puVar3 + uVar14 + 2;
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            bVar1 = *pbVar10;
            *pbVar6 = bVar1;
            pbVar6[-1] = bVar1;
            pbVar6[-2] = bVar1;
            pbVar10 = pbVar10 + 2;
            pbVar6 = pbVar6 + 3;
          }
          break;
        case 0x14:
          lVar7 = 0;
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            uVar2 = data[lVar7 + uVar11];
            puVar3[lVar7 * 2 + uVar14 + 2] = uVar2;
            puVar3[lVar7 * 2 + uVar14 + 1] = uVar2;
            puVar3[lVar7 * 2 + uVar14] = uVar2;
            puVar3[lVar7 * 2 + uVar14 + 3] = data[lVar7 + uVar11 + 1];
            lVar7 = lVar7 + 2;
          }
          break;
        case 0x19:
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            *pbVar6 = (byte)((uint)pbVar10[2] * 0x1d +
                             (uint)pbVar10[1] * 0x96 + (uint)*pbVar10 * 0x4d >> 8);
            pbVar10 = pbVar10 + 3;
            pbVar6 = pbVar6 + 1;
          }
          break;
        case 0x1a:
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            *pbVar6 = (byte)((uint)pbVar10[2] * 0x1d +
                             (uint)pbVar10[1] * 0x96 + (uint)*pbVar10 * 0x4d >> 8);
            pbVar6[1] = 0xff;
            pbVar10 = pbVar10 + 3;
            pbVar6 = pbVar6 + 2;
          }
          break;
        case 0x1c:
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            *pbVar6 = *pbVar10;
            pbVar6[1] = pbVar10[1];
            pbVar6[2] = pbVar10[2];
            pbVar6[3] = 0xff;
            pbVar10 = pbVar10 + 3;
            pbVar6 = pbVar6 + 4;
          }
          break;
        case 0x21:
          lVar7 = 0;
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            puVar3[lVar7 + uVar14] =
                 (uchar)((uint)data[lVar7 * 4 + uVar11 + 2] * 0x1d +
                         (uint)data[lVar7 * 4 + uVar11 + 1] * 0x96 +
                         (uint)data[lVar7 * 4 + uVar11] * 0x4d >> 8);
            lVar7 = lVar7 + 1;
          }
          break;
        case 0x22:
          lVar7 = 0;
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            puVar3[lVar7 + uVar14] =
                 (uchar)((uint)data[lVar7 * 2 + uVar11 + 2] * 0x1d +
                         (uint)data[lVar7 * 2 + uVar11 + 1] * 0x96 +
                         (uint)data[lVar7 * 2 + uVar11] * 0x4d >> 8);
            puVar3[lVar7 + uVar14 + 1] = data[lVar7 * 2 + uVar11 + 3];
            lVar7 = lVar7 + 2;
          }
          break;
        case 0x23:
          for (iVar5 = iVar8; -1 < iVar5; iVar5 = iVar5 + -1) {
            *pbVar6 = *pbVar10;
            pbVar6[1] = pbVar10[1];
            pbVar6[2] = pbVar10[2];
            pbVar10 = pbVar10 + 4;
            pbVar6 = pbVar6 + 3;
          }
        }
        uVar11 = (ulong)((int)uVar11 + x * img_n);
        uVar14 = (ulong)((int)uVar14 + x * req_comp);
      }
      free(data);
      data = puVar3;
    }
  }
  return data;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}